

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::kotlin::FieldGenerator::GenerateEnumField
          (FieldGenerator *this,Printer *printer)

{
  byte bVar1;
  FieldDescriptor *pFVar2;
  Context *pCVar3;
  pointer pcVar4;
  ClassNameResolver *this_00;
  EnumDescriptor *pEVar5;
  MessageLite *pMVar6;
  Nonnull<const_char_*> failure_msg;
  bool bVar7;
  long lVar8;
  string_view text;
  string_view text_00;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  JvmNameContext name_ctx;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  cleanup;
  anon_class_1_0_00000001 local_391;
  Printer *local_390;
  undefined1 *local_388;
  undefined8 local_380;
  undefined1 local_378;
  undefined7 uStack_377;
  long lStack_370;
  char *local_368;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> local_360;
  char local_358;
  undefined7 uStack_357;
  undefined8 uStack_350;
  char *local_348;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> local_340;
  char local_338;
  undefined7 uStack_337;
  undefined8 uStack_330;
  undefined1 *local_328 [2];
  undefined1 local_318;
  undefined7 uStack_317;
  undefined1 auStack_310 [8];
  string local_308;
  string local_2e8;
  undefined1 local_2c8 [56];
  code *local_290;
  byte local_288;
  _Alloc_hider local_280;
  size_type local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  bool local_260;
  _Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> local_258;
  undefined1 *local_210;
  undefined8 local_208;
  undefined1 local_200 [8];
  long lStack_1f8;
  string *local_1f0;
  undefined8 local_1e8;
  code *local_1e0;
  code *local_1d8;
  undefined1 local_1d0;
  undefined1 *local_1c8;
  undefined8 local_1c0;
  undefined1 local_1b8 [16];
  undefined1 local_1a8;
  undefined1 local_160;
  string local_158;
  undefined1 local_138 [8];
  _Alloc_hider local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  _Alloc_hider local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  undefined2 local_f0;
  undefined1 local_e8 [8];
  _Alloc_hider local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Alloc_hider local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  undefined2 local_a0;
  undefined1 local_98 [8];
  _Alloc_hider local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  undefined2 local_50;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  local_48;
  
  local_390 = printer;
  this_00 = java::Context::GetNameResolver(this->context_);
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"kt_type","");
  pEVar5 = FieldDescriptor::enum_type(this->descriptor_);
  java::ClassNameResolver::GetClassName_abi_cxx11_(&local_158,this_00,pEVar5,true);
  java::EscapeKotlinKeywords(&local_308,&local_158);
  io::Printer::Sub::Sub<std::__cxx11::string>((Sub *)local_2c8,&local_2e8,&local_308);
  vars.len_ = 1;
  vars.ptr_ = (pointer)local_2c8;
  io::Printer::WithDefs(&local_48,local_390,vars,false);
  if (local_258._M_engaged == true) {
    std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
              (&local_258);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_p != &local_270) {
    operator_delete(local_280._M_p,
                    CONCAT71(local_270._M_allocated_capacity._1_7_,local_270._M_local_buf[0]) + 1);
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
    ::_S_vtable._M_arr[local_288]._M_data)
            (&local_391,
             (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
              *)(local_2c8 + 0x20));
  local_288 = 0xff;
  if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
    operator_delete((void *)local_2c8._0_8_,local_2c8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,
                    CONCAT71(local_308.field_2._M_allocated_capacity._1_7_,
                             local_308.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  pFVar2 = this->descriptor_;
  bVar1 = pFVar2->field_0x1;
  bVar7 = (bool)((bVar1 & 0x20) >> 5);
  if (0xbf < bVar1 == bVar7) {
    if ((bVar1 & 0x20) == 0) {
      pCVar3 = this->context_;
      local_308._M_dataplus._M_p = &(pCVar3->options_).generate_immutable_code;
      local_308._M_string_length = (size_type)local_390;
      local_308.field_2._M_local_buf[0] = this->lite_;
      local_138[0] = (pCVar3->options_).generate_immutable_code;
      local_138[1] = (pCVar3->options_).generate_mutable_code;
      local_138[2] = (pCVar3->options_).generate_shared_code;
      local_138[3] = (pCVar3->options_).enforce_lite;
      local_138[4] = (pCVar3->options_).opensource_runtime;
      local_138[5] = (pCVar3->options_).annotate_code;
      local_130._M_p = (pointer)&local_120;
      pcVar4 = (pCVar3->options_).annotation_list_file._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,pcVar4,
                 pcVar4 + (pCVar3->options_).annotation_list_file._M_string_length);
      pcVar4 = (pCVar3->options_).output_list_file._M_dataplus._M_p;
      local_110._M_p = (pointer)&local_100;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,pcVar4,
                 pcVar4 + (pCVar3->options_).output_list_file._M_string_length);
      local_f0._0_1_ = (pCVar3->options_).strip_nonfunctional_codegen;
      local_f0._1_1_ = (pCVar3->options_).jvm_dsl;
      java::WriteFieldDocComment(local_390,pFVar2,(Options *)local_138,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_p != &local_100) {
        operator_delete(local_110._M_p,local_100._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_p != &local_120) {
        operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
      }
      local_348 = &local_338;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"jvm_name_get","");
      local_2c8._0_8_ = local_2c8 + 0x10;
      if (local_348 == &local_338) {
        local_2c8._24_8_ = uStack_330;
      }
      else {
        local_2c8._0_8_ = local_348;
      }
      local_2c8._8_8_ = local_340._M_head_impl;
      local_340._M_head_impl = (LogMessageData *)0x0;
      local_338 = '\0';
      local_2c8._40_8_ = 0;
      local_290 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      local_2c8._48_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
           ::_M_manager;
      local_288 = '\x01';
      local_280._M_p = (pointer)&local_270;
      local_278 = 0;
      local_270._M_local_buf[0] = '\0';
      local_260 = false;
      local_348 = &local_338;
      local_2c8._32_8_ = &local_308;
      std::__cxx11::string::_M_replace((ulong)&local_280,0,(char *)0x0,0x522f0c);
      local_258._M_engaged = false;
      local_328[0] = &local_318;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"jvm_name_set","");
      local_210 = local_200;
      if (local_328[0] == &local_318) {
        lStack_1f8 = (long)auStack_310;
      }
      else {
        local_210 = local_328[0];
      }
      local_208 = local_328[1];
      local_328[1] = (undefined1 *)0x0;
      local_318 = 0;
      local_1e8 = 0;
      local_1d8 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      local_1e0 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_manager;
      local_1d0 = 1;
      local_1c8 = local_1b8;
      local_1c0 = 0;
      local_1b8[0] = 0;
      local_1a8 = 0;
      local_328[0] = &local_318;
      local_1f0 = &local_308;
      std::__cxx11::string::_M_replace((ulong)&local_1c8,0,(char *)0x0,0x522f0c);
      local_160 = 0;
      io::Printer::Emit(local_390,local_2c8,2,0xc5);
      lVar8 = 0x170;
      do {
        if (local_2c8[lVar8 + -8] == '\x01') {
          std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                    ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                     (auStack_310 + lVar8));
        }
        if ((long *)((long)local_328 + lVar8) != *(long **)(&local_338 + lVar8)) {
          operator_delete(*(long **)(&local_338 + lVar8),*(long *)((long)local_328 + lVar8) + 1);
        }
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
          ::_S_vtable._M_arr[*(byte *)((long)&local_340._M_head_impl + lVar8)]._M_data)
                  (&local_391,
                   (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                    *)((long)&local_360._M_head_impl + lVar8));
        *(undefined1 *)((long)&local_340._M_head_impl + lVar8) = 0xff;
        if ((long *)((long)&lStack_370 + lVar8) != *(long **)((long)&local_380 + lVar8)) {
          operator_delete(*(long **)((long)&local_380 + lVar8),
                          *(long *)((long)&lStack_370 + lVar8) + 1);
        }
        lVar8 = lVar8 + -0xb8;
      } while (lVar8 != 0);
      if (local_328[0] != &local_318) {
        operator_delete(local_328[0],CONCAT71(uStack_317,local_318) + 1);
      }
      if (local_348 != &local_338) {
        operator_delete(local_348,CONCAT71(uStack_337,local_338) + 1);
      }
      pFVar2 = this->descriptor_;
      pMVar6 = protobuf::internal::ExtensionSet::GetMessage
                         (&(pFVar2->merged_features_->field_0)._impl_._extensions_,pb::java,
                          (MessageLite *)PTR__JavaFeatures_default_instance__00832a20);
      if (*(char *)((long)&pMVar6[1]._internal_metadata_.ptr_ + 4) == '\0') {
        pEVar5 = FieldDescriptor::enum_type(pFVar2);
        if (pEVar5 != (EnumDescriptor *)0x0) {
          pEVar5 = FieldDescriptor::enum_type(pFVar2);
          bVar7 = EnumDescriptor::is_closed(pEVar5);
          if (!bVar7) {
            local_368 = &local_358;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"jvm_name_get","");
            local_2c8._0_8_ = local_2c8 + 0x10;
            if (local_368 == &local_358) {
              local_2c8._24_8_ = uStack_350;
            }
            else {
              local_2c8._0_8_ = local_368;
            }
            local_2c8._8_8_ = local_360._M_head_impl;
            local_360._M_head_impl = (LogMessageData *)0x0;
            local_358 = '\0';
            local_2c8._40_8_ = 0;
            local_290 = std::
                        _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                        ::_M_invoke;
            local_2c8._48_8_ =
                 std::
                 _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                 ::_M_manager;
            local_288 = '\x01';
            local_280._M_p = (pointer)&local_270;
            local_278 = 0;
            local_270._M_local_buf[0] = '\0';
            local_260 = false;
            local_368 = &local_358;
            local_2c8._32_8_ = &local_308;
            std::__cxx11::string::_M_replace((ulong)&local_280,0,(char *)0x0,0x522f0c);
            local_258._M_engaged = false;
            local_388 = &local_378;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"jvm_name_set","");
            local_210 = local_200;
            if (local_388 == &local_378) {
              lStack_1f8 = lStack_370;
            }
            else {
              local_210 = local_388;
            }
            local_208 = local_380;
            local_380 = 0;
            local_378 = 0;
            local_1e8 = 0;
            local_1d8 = std::
                        _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                        ::_M_invoke;
            local_1e0 = std::
                        _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                        ::_M_manager;
            local_1d0 = 1;
            local_1c8 = local_1b8;
            local_1c0 = 0;
            local_1b8[0] = 0;
            local_1a8 = 0;
            local_388 = &local_378;
            local_1f0 = &local_308;
            std::__cxx11::string::_M_replace((ulong)&local_1c8,0,(char *)0x0,0x522f0c);
            local_160 = 0;
            io::Printer::Emit(local_390,local_2c8,2,0xdd);
            lVar8 = 0x170;
            do {
              if (local_2c8[lVar8 + -8] == '\x01') {
                std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::
                _M_destroy((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                            *)(auStack_310 + lVar8));
              }
              if ((long *)((long)local_328 + lVar8) != *(long **)(&local_338 + lVar8)) {
                operator_delete(*(long **)(&local_338 + lVar8),
                                *(long *)((long)local_328 + lVar8) + 1);
              }
              (*std::__detail::__variant::
                __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
                ::_S_vtable._M_arr[*(byte *)((long)&local_340._M_head_impl + lVar8)]._M_data)
                        (&local_391,
                         (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                          *)((long)&local_360._M_head_impl + lVar8));
              *(undefined1 *)((long)&local_340._M_head_impl + lVar8) = 0xff;
              if ((long *)((long)&lStack_370 + lVar8) != *(long **)((long)&local_380 + lVar8)) {
                operator_delete(*(long **)((long)&local_380 + lVar8),
                                *(long *)((long)&lStack_370 + lVar8) + 1);
              }
              lVar8 = lVar8 + -0xb8;
            } while (lVar8 != 0);
            if (local_388 != &local_378) {
              operator_delete(local_388,CONCAT71(uStack_377,local_378) + 1);
            }
            if (local_368 != &local_358) {
              operator_delete(local_368,CONCAT71(uStack_357,local_358) + 1);
            }
          }
        }
      }
      pFVar2 = this->descriptor_;
      pCVar3 = this->context_;
      local_98[4] = (pCVar3->options_).opensource_runtime;
      local_98[5] = (pCVar3->options_).annotate_code;
      local_98[0] = (pCVar3->options_).generate_immutable_code;
      local_98[1] = (pCVar3->options_).generate_mutable_code;
      local_98[2] = (pCVar3->options_).generate_shared_code;
      local_98[3] = (pCVar3->options_).enforce_lite;
      pcVar4 = (pCVar3->options_).annotation_list_file._M_dataplus._M_p;
      local_90._M_p = (pointer)&local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar4,
                 pcVar4 + (pCVar3->options_).annotation_list_file._M_string_length);
      pcVar4 = (pCVar3->options_).output_list_file._M_dataplus._M_p;
      local_70._M_p = (pointer)&local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar4,
                 pcVar4 + (pCVar3->options_).output_list_file._M_string_length);
      local_50._0_1_ = (pCVar3->options_).strip_nonfunctional_codegen;
      local_50._1_1_ = (pCVar3->options_).jvm_dsl;
      java::WriteFieldAccessorDocComment
                (local_390,pFVar2,CLEARER,(Options *)local_98,false,true,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_p != &local_60) {
        operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_p != &local_80) {
        operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
      }
      text._M_str = 
      "public fun ${$clear$kt_capitalized_name$$}$() {\n  $kt_dsl_builder$.${$clear$capitalized_name$$}$()\n}\n"
      ;
      text._M_len = 0x65;
      io::Printer::Print<>(local_390,text);
      bVar7 = FieldDescriptor::has_presence(this->descriptor_);
      if (bVar7) {
        pFVar2 = this->descriptor_;
        pCVar3 = this->context_;
        local_e8[4] = (pCVar3->options_).opensource_runtime;
        local_e8[5] = (pCVar3->options_).annotate_code;
        local_e8[0] = (pCVar3->options_).generate_immutable_code;
        local_e8[1] = (pCVar3->options_).generate_mutable_code;
        local_e8[2] = (pCVar3->options_).generate_shared_code;
        local_e8[3] = (pCVar3->options_).enforce_lite;
        pcVar4 = (pCVar3->options_).annotation_list_file._M_dataplus._M_p;
        local_e0._M_p = (pointer)&local_d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e0,pcVar4,
                   pcVar4 + (pCVar3->options_).annotation_list_file._M_string_length);
        pcVar4 = (pCVar3->options_).output_list_file._M_dataplus._M_p;
        local_c0._M_p = (pointer)&local_b0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c0,pcVar4,
                   pcVar4 + (pCVar3->options_).output_list_file._M_string_length);
        local_a0._0_1_ = (pCVar3->options_).strip_nonfunctional_codegen;
        local_a0._1_1_ = (pCVar3->options_).jvm_dsl;
        java::WriteFieldAccessorDocComment
                  (local_390,pFVar2,HAZZER,(Options *)local_e8,false,true,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_p != &local_b0) {
          operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_p != &local_d0) {
          operator_delete(local_e0._M_p,local_d0._M_allocated_capacity + 1);
        }
        text_00._M_str =
             "public fun ${$has$kt_capitalized_name$$}$(): kotlin.Boolean {\n  return $kt_dsl_builder$.${$has$capitalized_name$$}$()\n}\n"
        ;
        text_00._M_len = 0x78;
        io::Printer::Print<>(local_390,text_00);
      }
    }
    else {
      GenerateRepeatedEnumField(this,local_390);
    }
    absl::lts_20250127::
    Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
    ::~Cleanup(&local_48);
    return;
  }
  failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar7,0xbf < bVar1,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_2c8,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
             ,0xb54,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_2c8);
}

Assistant:

void FieldGenerator::GenerateEnumField(io::Printer* printer) const {
  auto name_resolver = context_->GetNameResolver();
  auto cleanup = printer->WithVars(
      {{"kt_type",
        java::EscapeKotlinKeywords(
            name_resolver->GetImmutableClassName(descriptor_->enum_type()))}});

  if (descriptor_->is_repeated()) {
    GenerateRepeatedEnumField(printer);
    return;
  }

  java::JvmNameContext name_ctx = {context_->options(), printer, lite_};
  WriteFieldDocComment(printer, descriptor_, context_->options(),
                       /* kdoc */ true);
  printer->Emit(
      {
          {"jvm_name_get",
           [&] { JvmName("${$get$kt_capitalized_name$$}$", name_ctx); }},
          {"jvm_name_set",
           [&] { JvmName("${$set$kt_capitalized_name$$}$", name_ctx); }},
      },
      "$kt_deprecation$public var $kt_name$: $kt_type$\n"
      "  $jvm_name_get$"
      "  get() = $kt_dsl_builder$.${$$kt_safe_name$$}$\n"
      "  $jvm_name_set$"
      "  set(value) {\n"
      "    $kt_dsl_builder$.${$$kt_safe_name$$}$ = value\n"
      "  }\n");

  if (java::SupportUnknownEnumValue(descriptor_)) {
    printer->Emit(
        {
            {"jvm_name_get",
             [&] { JvmName("${$get$kt_capitalized_name$Value$}$", name_ctx); }},
            {"jvm_name_set",
             [&] { JvmName("${$set$kt_capitalized_name$Value$}$", name_ctx); }},
        },
        "$kt_deprecation$public var $kt_name$Value: kotlin.Int\n"
        "  $jvm_name_get$"
        "  get() = $kt_dsl_builder$.${$$kt_property_name$Value$}$\n"
        "  $jvm_name_set$"
        "  set(value) {\n"
        "    $kt_dsl_builder$.${$$kt_property_name$Value$}$ = value\n"
        "  }\n");
  }

  WriteFieldAccessorDocComment(printer, descriptor_, java::CLEARER,
                               context_->options(),
                               /* builder */ false, /* kdoc */ true);
  printer->Print(
      "public fun ${$clear$kt_capitalized_name$$}$() {\n"
      "  $kt_dsl_builder$.${$clear$capitalized_name$$}$()\n"
      "}\n");

  if (descriptor_->has_presence()) {
    WriteFieldAccessorDocComment(printer, descriptor_, java::HAZZER,
                                 context_->options(),
                                 /* builder */ false, /* kdoc */ true);
    printer->Print(
        "public fun ${$has$kt_capitalized_name$$}$(): kotlin.Boolean {\n"
        "  return $kt_dsl_builder$.${$has$capitalized_name$$}$()\n"
        "}\n");
  }
}